

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O0

void UCNV_TO_U_CALLBACK_SKIP_63
               (void *context,UConverterToUnicodeArgs *toArgs,char *codeUnits,int32_t length,
               UConverterCallbackReason reason,UErrorCode *err)

{
  UErrorCode *err_local;
  UConverterCallbackReason reason_local;
  int32_t length_local;
  char *codeUnits_local;
  UConverterToUnicodeArgs *toArgs_local;
  void *context_local;
  
  if (((int)reason < 3) &&
     ((context == (void *)0x0 || ((*context == 'i' && (reason == UCNV_UNASSIGNED)))))) {
    *err = U_ZERO_ERROR;
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
UCNV_TO_U_CALLBACK_SKIP (
                 const void *context,
                 UConverterToUnicodeArgs *toArgs,
                 const char* codeUnits,
                 int32_t length,
                 UConverterCallbackReason reason,
                 UErrorCode * err)
{
    (void)toArgs;
    (void)codeUnits;
    (void)length;
    if (reason <= UCNV_IRREGULAR)
    {
        if (context == NULL || (*((char*)context) == UCNV_PRV_STOP_ON_ILLEGAL && reason == UCNV_UNASSIGNED))
        {
            *err = U_ZERO_ERROR;
        }
        /* else the caller must have set the error code accordingly. */
    }
    /* else ignore the reset, close and clone calls. */
}